

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

uint64_t __thiscall BitStreamReader<SpanReader>::Read(BitStreamReader<SpanReader> *this,int nbits)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  out_of_range *this_00;
  int iVar4;
  uint64_t uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)nbits < 0x41) {
    uVar5 = 0;
    for (; 0 < nbits; nbits = nbits - iVar2) {
      iVar4 = this->m_offset;
      if (iVar4 == 8) {
        bVar3 = ser_readdata8<SpanReader>(this->m_istream);
        this->m_buffer = bVar3;
        this->m_offset = 0;
        iVar4 = 0;
      }
      else {
        bVar3 = this->m_buffer;
      }
      iVar2 = 8 - iVar4;
      if (nbits < 8 - iVar4) {
        iVar2 = nbits;
      }
      uVar5 = uVar5 << ((byte)iVar2 & 0x3f) |
              (ulong)(((uint)bVar3 << ((byte)iVar4 & 0x1f) & 0xff) >> (8 - (byte)iVar2 & 0x1f));
      this->m_offset = iVar4 + iVar2;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return uVar5;
    }
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Read(int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        uint64_t data = 0;
        while (nbits > 0) {
            if (m_offset == 8) {
                m_istream >> m_buffer;
                m_offset = 0;
            }

            int bits = std::min(8 - m_offset, nbits);
            data <<= bits;
            data |= static_cast<uint8_t>(m_buffer << m_offset) >> (8 - bits);
            m_offset += bits;
            nbits -= bits;
        }
        return data;
    }